

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

int countzerobits(bitmap bmp,int from,int to)

{
  int iVar1;
  
  iVar1 = 0;
  if (from < to) {
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(-1 < (char)(bmp[from >> 3] << (from & 7U)));
      from = from + 1;
    } while (to != from);
  }
  return iVar1;
}

Assistant:

int countzerobits(bitmap bmp, int from, int to){
  int z=0;
  for(int j=from;j<to;j++){
    if(!getbit(j,bmp)){
      z++;
    }
  }
  return z;
}